

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  nk_vec2 nVar1;
  nk_chart_type nVar2;
  int iVar3;
  int iVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  void *pvVar7;
  nk_flags nVar8;
  nk_flags nVar9;
  uint uVar10;
  nk_color nVar11;
  int *piVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  float fVar20;
  float fVar21;
  nk_rect rect;
  nk_rect rect_00;
  float local_48;
  float fStack_44;
  
  if (ctx == (nk_context *)0x0) {
    return 0;
  }
  pnVar5 = ctx->current;
  if (3 < slot || pnVar5 == (nk_window *)0x0) {
    return 0;
  }
  pnVar6 = pnVar5->layout;
  if ((pnVar6->chart).slot <= slot) {
    return 0;
  }
  nVar2 = (pnVar6->chart).slots[slot].type;
  if (nVar2 == NK_CHART_COLUMN) {
    iVar3 = (pnVar6->chart).slots[slot].count;
    iVar4 = (pnVar6->chart).slots[slot].index;
    if (iVar3 <= iVar4) {
      return 0;
    }
    if (iVar3 == 0) {
      fVar13 = 0.0;
    }
    else {
      fVar13 = ((pnVar6->chart).w - (float)(iVar3 + -1)) / (float)iVar3;
    }
    fVar20 = (pnVar6->chart).h;
    fVar14 = (pnVar6->chart).slots[slot].range;
    fVar18 = value / fVar14;
    fVar17 = -fVar18;
    if (-fVar18 <= fVar18) {
      fVar17 = fVar18;
    }
    fVar17 = fVar17 * fVar20;
    if (0.0 <= value) {
      fVar18 = (pnVar6->chart).slots[slot].min;
      fVar21 = -fVar18;
      if (-fVar18 <= fVar18) {
        fVar21 = fVar18;
      }
      fVar18 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar18 = fVar14;
      }
      fVar20 = ((pnVar6->chart).y + fVar20) - ((fVar21 + value) / fVar18) * fVar20;
    }
    else {
      fVar14 = (value - (pnVar6->chart).slots[slot].max) / fVar14;
      fVar18 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar18 = fVar14;
      }
      fVar20 = (fVar20 * fVar18 + (pnVar6->chart).y) - fVar17;
    }
    fVar14 = (float)iVar4;
    nVar11 = (pnVar6->chart).slots[slot].color;
    uVar19 = CONCAT44(fVar17,fVar13);
    fVar14 = fVar14 * fVar13 + (pnVar6->chart).x + fVar14;
    uVar15 = CONCAT44(fVar20,fVar14);
    nVar9 = 0;
    nVar8 = 0;
    if (((((pnVar6->flags & 0x1000) == 0) && (fVar18 = (ctx->input).mouse.pos.x, fVar14 <= fVar18))
        && (nVar8 = nVar9, fVar18 < fVar13 + fVar14)) &&
       ((fVar13 = (ctx->input).mouse.pos.y, fVar20 <= fVar13 && (fVar13 < fVar17 + fVar20)))) {
      nVar8 = 1;
      if ((ctx->input).mouse.buttons[0].down == 0) {
        nVar8 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
      }
      nVar11 = (pnVar6->chart).slots[slot].highlight;
    }
    piVar12 = &(pnVar6->chart).slots[slot].index;
  }
  else {
    if (nVar2 != NK_CHART_LINES) {
      return 0;
    }
    fVar13 = (pnVar6->chart).slots[slot].min;
    fVar13 = (value - fVar13) / ((pnVar6->chart).slots[slot].max - fVar13);
    piVar12 = &(pnVar6->chart).slots[slot].index;
    if (*piVar12 != 0) {
      nVar11 = (pnVar6->chart).slots[slot].color;
      fVar20 = (pnVar6->chart).h;
      fVar14 = (pnVar6->chart).x +
               (float)*piVar12 * ((pnVar6->chart).w / (float)(pnVar6->chart).slots[slot].count);
      fVar13 = (pnVar6->chart).y + fVar20 + fVar20 * -fVar13;
      nVar1 = (pnVar6->chart).slots[slot].last;
      pvVar7 = nk_command_buffer_push(&pnVar5->buffer,NK_COMMAND_LINE,0x20);
      if (pvVar7 != (void *)0x0) {
        *(undefined2 *)((long)pvVar7 + 0x10) = 1;
        local_48 = nVar1.x;
        fStack_44 = nVar1.y;
        auVar16._0_4_ = (int)local_48;
        auVar16._4_4_ = (int)fStack_44;
        auVar16._8_4_ = (int)fVar14;
        auVar16._12_4_ = (int)fVar13;
        auVar16 = packssdw(auVar16,auVar16);
        *(long *)((long)pvVar7 + 0x12) = auVar16._0_8_;
        *(nk_color *)((long)pvVar7 + 0x1a) = nVar11;
      }
      nVar9 = 0;
      nVar8 = 0;
      if ((pnVar6->flags & 0x1000) == 0) {
        fVar20 = (ctx->input).mouse.pos.x;
        nVar8 = nVar9;
        if ((fVar14 + -3.0 <= fVar20) && (fVar20 < fVar14 + -3.0 + 6.0)) {
          fVar20 = (ctx->input).mouse.pos.y;
          if ((fVar13 + -3.0 <= fVar20) && (fVar20 < fVar13 + -3.0 + 6.0)) {
            nVar8 = 1;
            if ((ctx->input).mouse.buttons[0].down == 0) {
              nVar8 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
            }
            nVar11 = (pnVar6->chart).slots[slot].highlight;
          }
        }
      }
      rect.x = fVar14 + -2.0;
      rect.y = fVar13 + -2.0;
      rect.w = 4.0;
      rect.h = 4.0;
      nk_fill_rect(&pnVar5->buffer,rect,0.0,nVar11);
      nVar1.y = fVar13;
      nVar1.x = fVar14;
      (pnVar6->chart).slots[slot].last = nVar1;
      goto LAB_00127173;
    }
    fVar20 = (pnVar6->chart).x;
    (pnVar6->chart).slots[slot].last.x = fVar20;
    fVar14 = (pnVar6->chart).h;
    fVar17 = ((pnVar6->chart).y + fVar14) - fVar13 * fVar14;
    (pnVar6->chart).slots[slot].last.y = fVar17;
    fVar13 = fVar20 + -2.0;
    fVar14 = fVar17 + -2.0;
    uVar15 = CONCAT44(fVar14,fVar13);
    nVar11 = (pnVar6->chart).slots[slot].color;
    nVar9 = 0;
    nVar8 = 0;
    if ((pnVar6->flags & 0x1000) == 0) {
      fVar18 = (ctx->input).mouse.pos.x;
      if ((fVar20 + -3.0 <= fVar18) && (nVar8 = nVar9, fVar18 < fVar20 + -3.0 + 6.0)) {
        fVar20 = (ctx->input).mouse.pos.y;
        if ((fVar17 + -3.0 <= fVar20) && (fVar20 < fVar17 + -3.0 + 6.0)) {
          if ((ctx->input).mouse.buttons[0].down == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2;
          }
          nVar8 = uVar10 | -(uint)((fVar18 < fVar13 + 4.0 && fVar13 <= fVar18) &&
                                  (fVar20 < fVar14 + 4.0 && fVar14 <= fVar20)) & 1;
          nVar11 = (pnVar6->chart).slots[slot].highlight;
        }
      }
    }
    uVar19 = 0x4080000040800000;
  }
  rect_00.w = (float)(int)uVar19;
  rect_00.h = (float)(int)((ulong)uVar19 >> 0x20);
  rect_00.x = (float)(int)uVar15;
  rect_00.y = (float)(int)((ulong)uVar15 >> 0x20);
  nk_fill_rect(&pnVar5->buffer,rect_00,0.0,nVar11);
LAB_00127173:
  *piVar12 = *piVar12 + 1;
  return nVar8;
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
nk_flags flags;
struct nk_window *win;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
NK_ASSERT(slot < ctx->current->layout->chart.slot);
if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
if (slot >= ctx->current->layout->chart.slot) return nk_false;

win = ctx->current;
if (win->layout->chart.slot < slot) return nk_false;
switch (win->layout->chart.slots[slot].type) {
case NK_CHART_LINES:
flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
case NK_CHART_COLUMN:
flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
default:
case NK_CHART_MAX:
flags = 0;
}
return flags;
}